

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int clearCell(MemPage *pPage,uchar *pCell,CellInfo *pInfo)

{
  BtShared *pBt;
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  MemPage *pMemPage;
  Pgno iNext;
  MemPage *pOvfl;
  Pgno local_3c;
  MemPage *local_38;
  
  (*pPage->xParseCell)(pPage,pCell,pInfo);
  iVar2 = 0;
  if (pInfo->nPayload != (uint)pInfo->nLocal) {
    if (pPage->aDataEnd < pCell + pInfo->nSize) {
      uVar3 = 0x10e5c;
    }
    else {
      pBt = pPage->pBt;
      uVar5 = pBt->usableSize - 4;
      uVar1 = pInfo->nPayload + ~(uint)pInfo->nLocal;
      if (CARRY4(uVar1,uVar5)) {
        return 0;
      }
      uVar4 = (ulong)(uVar1 + uVar5) / (ulong)uVar5;
      uVar1 = *(uint *)(pCell + pInfo->nSize + -4);
      uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      while( true ) {
        local_3c = 0;
        local_38 = (MemPage *)0x0;
        if ((uVar1 < 2) || (pBt->nPage < uVar1)) break;
        uVar5 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar5;
        if (uVar5 == 0) {
LAB_0013728f:
          local_38 = btreePageLookup(pBt,uVar1);
          if (local_38 != (MemPage *)0x0) goto LAB_001372a7;
          pMemPage = (MemPage *)0x0;
LAB_001372e2:
          iVar2 = freePage2(pBt,pMemPage,uVar1);
        }
        else {
          iVar2 = getOverflowPage(pBt,uVar1,&local_38,&local_3c);
          if (iVar2 != 0) {
            return iVar2;
          }
          if (local_38 == (MemPage *)0x0) goto LAB_0013728f;
LAB_001372a7:
          pMemPage = local_38;
          if (local_38->pDbPage->nRef == 1) goto LAB_001372e2;
          iVar2 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10e81,
                      "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
        }
        if ((local_38 != (MemPage *)0x0) && (local_38->pDbPage != (DbPage *)0x0)) {
          sqlite3PagerUnrefNotNull(local_38->pDbPage);
        }
        if (iVar2 != 0) {
          return iVar2;
        }
        uVar1 = local_3c;
        if (uVar5 == 0) {
          return 0;
        }
      }
      uVar3 = 0x10e6d;
    }
    iVar2 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar3,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  }
  return iVar2;
}

Assistant:

static int clearCell(
  MemPage *pPage,          /* The page that contains the Cell */
  unsigned char *pCell,    /* First byte of the Cell */
  CellInfo *pInfo          /* Size information about the cell */
){
  BtShared *pBt;
  Pgno ovflPgno;
  int rc;
  int nOvfl;
  u32 ovflPageSize;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  pPage->xParseCell(pPage, pCell, pInfo);
  if( pInfo->nLocal==pInfo->nPayload ){
    return SQLITE_OK;  /* No overflow pages. Return without doing anything */
  }
  testcase( pCell + pInfo->nSize == pPage->aDataEnd );
  testcase( pCell + (pInfo->nSize-1) == pPage->aDataEnd );
  if( pCell + pInfo->nSize > pPage->aDataEnd ){
    /* Cell extends past end of page */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  ovflPgno = get4byte(pCell + pInfo->nSize - 4);
  pBt = pPage->pBt;
  assert( pBt->usableSize > 4 );
  ovflPageSize = pBt->usableSize - 4;
  nOvfl = (pInfo->nPayload - pInfo->nLocal + ovflPageSize - 1)/ovflPageSize;
  assert( nOvfl>0 || 
    (CORRUPT_DB && (pInfo->nPayload + ovflPageSize)<ovflPageSize)
  );
  while( nOvfl-- ){
    Pgno iNext = 0;
    MemPage *pOvfl = 0;
    if( ovflPgno<2 || ovflPgno>btreePagecount(pBt) ){
      /* 0 is not a legal page number and page 1 cannot be an 
      ** overflow page. Therefore if ovflPgno<2 or past the end of the 
      ** file the database must be corrupt. */
      return SQLITE_CORRUPT_BKPT;
    }
    if( nOvfl ){
      rc = getOverflowPage(pBt, ovflPgno, &pOvfl, &iNext);
      if( rc ) return rc;
    }

    if( ( pOvfl || ((pOvfl = btreePageLookup(pBt, ovflPgno))!=0) )
     && sqlite3PagerPageRefcount(pOvfl->pDbPage)!=1
    ){
      /* There is no reason any cursor should have an outstanding reference 
      ** to an overflow page belonging to a cell that is being deleted/updated.
      ** So if there exists more than one reference to this page, then it 
      ** must not really be an overflow page and the database must be corrupt. 
      ** It is helpful to detect this before calling freePage2(), as 
      ** freePage2() may zero the page contents if secure-delete mode is
      ** enabled. If this 'overflow' page happens to be a page that the
      ** caller is iterating through or using in some other way, this
      ** can be problematic.
      */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = freePage2(pBt, pOvfl, ovflPgno);
    }

    if( pOvfl ){
      sqlite3PagerUnref(pOvfl->pDbPage);
    }
    if( rc ) return rc;
    ovflPgno = iNext;
  }
  return SQLITE_OK;
}